

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O0

void md5_finish(md5_state_t *pms,md5_byte_t *digest)

{
  long lVar1;
  long in_RSI;
  md5_byte_t *in_RDI;
  md5_state_t *unaff_retaddr;
  int i;
  md5_byte_t data [8];
  uint local_1c;
  undefined1 local_18 [12];
  int nbytes;
  
  for (local_1c = 0; (int)local_1c < 8; local_1c = local_1c + 1) {
    local_18[(int)local_1c] =
         (char)(*(uint *)(in_RDI + (long)((int)local_1c >> 2) * 4) >> (sbyte)((local_1c & 3) << 3));
  }
  nbytes = (int)((ulong)in_RSI >> 0x20);
  lVar1 = in_RSI;
  md5_append(unaff_retaddr,in_RDI,nbytes);
  stack0xfffffffffffffff0 = lVar1;
  lVar1 = stack0xfffffffffffffff0;
  nbytes = (int)((ulong)stack0xfffffffffffffff0 >> 0x20);
  md5_append(unaff_retaddr,in_RDI,nbytes);
  stack0xfffffffffffffff0 = lVar1;
  for (local_1c = 0; (int)local_1c < 0x10; local_1c = local_1c + 1) {
    *(char *)(stack0xfffffffffffffff0 + (int)local_1c) =
         (char)(*(uint *)(in_RDI + (long)((int)local_1c >> 2) * 4 + 8) >>
               (sbyte)((local_1c & 3) << 3));
  }
  return;
}

Assistant:

void
md5_finish(md5_state_t *pms, md5_byte_t digest[16])
{
    static const md5_byte_t pad[64] = {
        0x80, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
        0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
        0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
        0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0
    };
    md5_byte_t data[8];
    int i;

    /* Save the length before padding. */
    for (i = 0; i < 8; ++i)
        data[i] = (md5_byte_t)(pms->count[i >> 2] >> ((i & 3) << 3));
    /* Pad to 56 bytes mod 64. */
    md5_append(pms, pad, ((55 - (pms->count[0] >> 3)) & 63) + 1);
    /* Append the length. */
    md5_append(pms, data, 8);
    for (i = 0; i < 16; ++i)
        digest[i] = (md5_byte_t)(pms->abcd[i >> 2] >> ((i & 3) << 3));
}